

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_bool nk_input_any_mouse_click_in_rect(nk_input *in,nk_rect b)

{
  int iVar1;
  nk_buttons id;
  bool bVar2;
  
  iVar1 = 0;
  for (id = NK_BUTTON_LEFT; id != NK_BUTTON_MAX; id = id + NK_BUTTON_MIDDLE) {
    bVar2 = iVar1 == 0;
    iVar1 = 1;
    if (bVar2) {
      iVar1 = nk_input_is_mouse_click_in_rect(in,id,b);
    }
  }
  return iVar1;
}

Assistant:

NK_API nk_bool
nk_input_any_mouse_click_in_rect(const struct nk_input *in, struct nk_rect b)
{
int i, down = 0;
for (i = 0; i < NK_BUTTON_MAX; ++i)
down = down || nk_input_is_mouse_click_in_rect(in, (enum nk_buttons)i, b);
return down;
}